

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O3

ostream * operator<<(ostream *os,JSONValue *v)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  
  bVar3 = SUB81(os,0);
  switch(v->type) {
  case None:
    std::__ostream_insert<char,std::char_traits<char>>(os,"None",4);
    break;
  case Number:
    std::__ostream_insert<char,std::char_traits<char>>(os,"Number ",7);
    std::ostream::_M_insert<double>((v->field_1).dvalue);
    break;
  case String:
    std::__ostream_insert<char,std::char_traits<char>>(os,"String ",7);
    std::ostream::_M_insert<void_const*>(os);
    break;
  case Boolean:
    std::__ostream_insert<char,std::char_traits<char>>(os,"Boolean ",8);
    std::ostream::_M_insert<bool>(bVar3);
    break;
  case List:
    pcVar2 = "List";
    lVar1 = 4;
    goto LAB_0010dc61;
  case Object:
    pcVar2 = "Object";
    lVar1 = 6;
LAB_0010dc61:
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + bVar3);
    std::ostream::put(bVar3);
    std::ostream::flush();
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const JSONValue& v)
{
    switch (v.type)
    {
    case JSONType::None:
        os << "None";
        break;
    case JSONType::Number:
        os << "Number " << v.dvalue;
        break;
    case JSONType::String:
        os << "String " << v.svalue;
        break;
    case JSONType::Boolean:
        os << "Boolean " << v.bvalue;
        break;
    case JSONType::List:
        os << "List" << std::endl;
        break;
    case JSONType::Object:
        os << "Object" << std::endl;
        break;
    }
    return os;
}